

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
CBucket::insert(CBucket *this,AbstractSearchState *AbstractSearchState1,int priority)

{
  vector<AbstractSearchState*,std::allocator<AbstractSearchState*>> *this_00;
  iterator __position;
  iterator __position_00;
  int startbucketindex;
  int iVar1;
  int *piVar2;
  int local_34;
  AbstractSearchState *local_30;
  
  if (priority == 1000000000) {
    iVar1 = this->numofbuckets;
    startbucketindex = iVar1 + -1;
  }
  else {
    startbucketindex = priority - this->firstpriority;
    iVar1 = this->numofbuckets;
    if (iVar1 + -2 <= startbucketindex) {
      startbucketindex = iVar1 + -2;
    }
  }
  this_00 = (vector<AbstractSearchState*,std::allocator<AbstractSearchState*>> *)
            (this->bucketV + startbucketindex);
  __position._M_current = *(AbstractSearchState ***)(this_00 + 8);
  local_34 = priority;
  local_30 = AbstractSearchState1;
  if (__position._M_current == *(AbstractSearchState ***)(this_00 + 0x10)) {
    std::vector<AbstractSearchState*,std::allocator<AbstractSearchState*>>::
    _M_realloc_insert<AbstractSearchState*const&>(this_00,__position,&local_30);
    iVar1 = this->numofbuckets;
  }
  else {
    *__position._M_current = AbstractSearchState1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  local_30->heapindex =
       (int)((ulong)((long)this->bucketV[startbucketindex].
                           super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this->bucketV[startbucketindex].
                          super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  if (startbucketindex == iVar1 + -2) {
    __position_00._M_current =
         (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->assortedpriorityV,__position_00,&local_34
                );
      piVar2 = (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *__position_00._M_current = priority;
      piVar2 = __position_00._M_current + 1;
      (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    iVar1 = (int)((ulong)((long)piVar2 -
                         (long)(this->assortedpriorityV).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    if (this->maxassortedpriorityVsize < iVar1) {
      this->maxassortedpriorityVsize = iVar1;
    }
  }
  if (local_34 < this->currentminelement_priority || this->currentminelement_priority == 1000000000)
  {
    recomputeminelementupfrombucket(this,startbucketindex);
  }
  return;
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int priority)
    {
        //compute bucket index
        int bucketindex = priority - firstpriority;
        if (priority == INFINITECOST) {
            bucketindex = numofbuckets - 1;
        }
        else if (bucketindex >= numofbuckets - 2) {
            bucketindex = numofbuckets - 2; //overflow bucket
        }

        //insert the element itself
        bucketV[bucketindex].push_back(AbstractSearchState1);
        AbstractSearchState1->heapindex = (int)bucketV[bucketindex].size() - 1;

        if (bucketindex == numofbuckets - 2) {
            assortedpriorityV.push_back(priority);

            if (maxassortedpriorityVsize < (int)assortedpriorityV.size()) maxassortedpriorityVsize
                = (int)assortedpriorityV.size();
        }

        //re-compute minelement if necessary
        if (priority < currentminelement_priority || currentminelement_priority == INFINITECOST) {
            recomputeminelementupfrombucket(bucketindex);
        }
    }